

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_3fVector::Unitize(ON_3fVector *this)

{
  double dVar1;
  double dz;
  double dy;
  double dx;
  double d;
  bool rc;
  ON_3fVector *this_local;
  
  dVar1 = Length(this);
  if (0.0 < dVar1) {
    this->x = (float)((double)this->x / dVar1);
    this->y = (float)((double)this->y / dVar1);
    this->z = (float)((double)this->z / dVar1);
  }
  return 0.0 < dVar1;
}

Assistant:

bool ON_3fVector::Unitize()
{
  bool rc = false;
  // Since x,y,z are floats, d will not be denormalized and the
  // ON_DBL_MIN tests in ON_2dVector::Unitize() are not needed.
  double d = Length();
  if ( d > 0.0 ) 
  {
    double dx = x;
    double dy = y;
    double dz = z;
    x = (float)(dx/d);
    y = (float)(dy/d);
    z = (float)(dz/d);
    rc = true;
  }
  return rc;
}